

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

void __thiscall Console::Prompt::Private::~Private(Private *this)

{
  uint *puVar1;
  byte *pbVar2;
  code *pcVar3;
  int iVar4;
  
  if (this->valid == true) {
    redirectPendingData(this);
    if (resizeEventFd != 0) {
      signal(0x1c,(__sighandler_t)0x1);
      close(resizeEventFd);
      resizeEventFd = 0;
    }
    restoreTermMode();
    originalTermiosValid = false;
    iVar4 = dup2(originalStdout,1);
    if (iVar4 == -1) {
      iVar4 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                            ,0x11f,"dup2(originalStdout, STDOUT_FILENO) != -1");
      if (iVar4 != 0) goto LAB_00105759;
    }
    iVar4 = dup2(this->originalStderr,2);
    if (iVar4 == -1) {
      iVar4 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                            ,0x120,"dup2(originalStderr, STDERR_FILENO) != -1");
      if (iVar4 != 0) {
LAB_00105759:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
    }
    close(originalStdout);
    close(this->originalStderr);
    close(this->stdoutRead);
    close(this->stdoutWrite);
    close(this->stderrRead);
    close(this->stderrWrite);
    originalStdout = -1;
  }
  List<String>::~List(&this->history);
  puVar1 = (this->input)._begin.item;
  if (puVar1 != (uint *)0x0) {
    operator_delete__(puVar1);
  }
  puVar1 = (this->prompt)._begin.item;
  if (puVar1 != (uint *)0x0) {
    operator_delete__(puVar1);
  }
  pbVar2 = (this->bufferedOutput).buffer;
  if (pbVar2 != (byte *)0x0) {
    operator_delete__(pbVar2);
  }
  pbVar2 = (this->bufferedInput).buffer;
  if (pbVar2 != (byte *)0x0) {
    operator_delete__(pbVar2);
    return;
  }
  return;
}

Assistant:

~Private()
  {
    if(!valid)
      return;
    redirectPendingData();
#ifdef _MSC_VER
    CancelIo(hStdOutRead);
    CancelIo(hStdErrRead);
    CloseHandle(outOverlapped.hEvent);
    CloseHandle(errOverlapped.hEvent);
    _dup2(originalStdout, _fileno(stdout));
    _dup2(originalStderr, _fileno(stderr));
    SetStdHandle(STD_OUTPUT_HANDLE, (HANDLE)_get_osfhandle(_fileno(stdout)));
    SetStdHandle(STD_ERROR_HANDLE, (HANDLE)_get_osfhandle(_fileno(stderr)));
    _close(originalStdout); // this should close hOriginalStdOut
    _close(originalStderr); // this should close hOriginalStdErr
    _close(newStdout); // this should close hStdOutWrite
    _close(newStderr); // this should close hStdOutWrite
    CloseHandle(hStdOutRead);
    CloseHandle(hStdErrRead);
    VERIFY(SetConsoleMode(GetStdHandle(STD_INPUT_HANDLE), consoleInputMode));
#else
    if(resizeEventFd)
    {
      signal(SIGWINCH, SIG_IGN);
      close(resizeEventFd);
#ifdef __CYGWIN__
      close(resizeEventFdWrite);
      resizeEventFdWrite = 0;
#endif
      resizeEventFd = 0;
    }
    restoreTermMode();
    originalTermiosValid = false;
    VERIFY(dup2(originalStdout, STDOUT_FILENO) != -1);
    VERIFY(dup2(originalStderr, STDERR_FILENO) != -1);
    close(originalStdout);
    close(originalStderr);
    close(stdoutRead);
    close(stdoutWrite);
    close(stderrRead);
    close(stderrWrite);
    originalStdout = -1;
#endif
  }